

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_config_delta.c
# Opt level: O0

void handler_modify_section(void)

{
  int iVar1;
  _Bool local_4a;
  _Bool local_49;
  
  callback_counter = callback_counter + 1;
  cunit_named_check(callback_counter == 1,"handler_modify_section",0x17a,
                    "Callback was called %d times!",(ulong)callback_counter);
  if (callback_counter < 2) {
    cunit_named_check(handler_1.pre != (cfg_named_section *)0x0,"handler_modify_section",0x17e,
                      "No pre named-section found.");
    cunit_named_check(handler_1.post != (cfg_named_section *)0x0,"handler_modify_section",0x17f,
                      "No post named-section found.");
    if ((handler_1.post != (cfg_named_section *)0x0) && (handler_1.pre != (cfg_named_section *)0x0))
    {
      local_49 = false;
      if ((handler_1.pre)->name != (char *)0x0) {
        iVar1 = strcmp((handler_1.pre)->name,"name_1");
        local_49 = iVar1 == 0;
      }
      cunit_named_check(local_49,"handler_modify_section",0x186,
                        "Illegal name of changed pre section: %s",(handler_1.pre)->name);
      local_4a = false;
      if ((handler_1.post)->name != (char *)0x0) {
        iVar1 = strcmp((handler_1.post)->name,"name_1");
        local_4a = iVar1 == 0;
      }
      cunit_named_check(local_4a,"handler_modify_section",0x189,
                        "Illegal name of changed post section: %s",(handler_1.post)->name);
      cunit_named_check((_Bool)(entries_1[0].delta_changed & 1),"handler_modify_section",0x18b,
                        "Key 1 did not change!");
      cunit_named_check((_Bool)(entries_1[1].delta_changed & 1),"handler_modify_section",0x18c,
                        "Key 2 did not change!");
      cunit_named_check((_Bool)((entries_1[2].delta_changed ^ 0xffU) & 1),"handler_modify_section",
                        0x18d,"Key 3 did change!");
      iVar1 = strarray_cmp(entries_1[0].pre,&value_2);
      cunit_named_check(iVar1 == 0,"handler_modify_section",400,"Unknown pre data for key 1: %s",
                        (entries_1[0].pre)->value);
      iVar1 = strarray_cmp(entries_1[1].pre,&value_3);
      cunit_named_check(iVar1 == 0,"handler_modify_section",0x192,"Unknown pre data for key 1: %s",
                        (entries_1[1].pre)->value);
      iVar1 = strarray_cmp(entries_1[0].post,&value_1);
      cunit_named_check(iVar1 == 0,"handler_modify_section",0x195,"Unknown post data for key 1: %s",
                        (entries_1[0].post)->value);
      iVar1 = strarray_cmp(entries_1[1].post,&value_2);
      cunit_named_check(iVar1 == 0,"handler_modify_section",0x197,"Unknown post data for key 1: %s",
                        (entries_1[1].post)->value);
    }
  }
  return;
}

Assistant:

static void
handler_modify_section(void) {
  callback_counter++;

  CHECK_TRUE(callback_counter == 1, "Callback was called %d times!", callback_counter);
  if (callback_counter > 1) {
    return;
  }
  CHECK_TRUE(handler_1.pre != NULL, "No pre named-section found.");
  CHECK_TRUE(handler_1.post != NULL, "No post named-section found.");

  if (handler_1.post == NULL || handler_1.pre == NULL) {
    return;
  }

  CHECK_TRUE(handler_1.pre->name != NULL && strcmp(handler_1.pre->name, NAME_1) == 0,
      "Illegal name of changed pre section: %s", handler_1.pre->name);

  CHECK_TRUE(handler_1.post->name != NULL && strcmp(handler_1.post->name, NAME_1) == 0,
      "Illegal name of changed post section: %s", handler_1.post->name);

  CHECK_TRUE( entries_1[0].delta_changed, "Key 1 did not change!");
  CHECK_TRUE( entries_1[1].delta_changed, "Key 2 did not change!");
  CHECK_TRUE(!entries_1[2].delta_changed, "Key 3 did change!");

  CHECK_TRUE(strarray_cmp_c(entries_1[0].pre, &value_2) == 0,
      "Unknown pre data for key 1: %s", entries_1[0].pre->value);
  CHECK_TRUE(strarray_cmp_c(entries_1[1].pre, &value_3) == 0,
      "Unknown pre data for key 1: %s", entries_1[1].pre->value);

  CHECK_TRUE(strarray_cmp_c(entries_1[0].post, &value_1) == 0,
      "Unknown post data for key 1: %s", entries_1[0].post->value);
  CHECK_TRUE(strarray_cmp_c(entries_1[1].post, &value_2) == 0,
      "Unknown post data for key 1: %s", entries_1[1].post->value);
}